

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

void __thiscall toml::internal::Parser::nextKey(Parser *this)

{
  Token *in_RDI;
  Token *in_stack_ffffffffffffffa8;
  
  Lexer::nextKeyToken((Lexer *)in_stack_ffffffffffffffa8);
  Token::operator=(in_RDI,in_stack_ffffffffffffffa8);
  Token::~Token((Token *)0x22ef7a);
  return;
}

Assistant:

void nextKey() { token_ = lexer_.nextKeyToken(); }